

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void duckdb::FunctionBinder::BindSortedAggregate(ClientContext *context,BoundWindowExpression *expr)

{
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *bind_info;
  vector<duckdb::BoundOrderByNode,_true> *this;
  OrderType type;
  OrderByNullType null_order;
  pointer pBVar1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var4;
  ClientContext *context_p;
  size_type sVar5;
  bool bVar6;
  pointer pEVar7;
  SortedAggregateBindData *this_00;
  type pAVar8;
  pointer pSVar9;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  BoundOrderByNode *order;
  pointer pBVar10;
  templated_unique_single_t sorted_bind;
  vector<duckdb::LogicalType,_true> arguments;
  AggregateFunction ordered_aggregate;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a8;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_1a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_198;
  type local_180;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
  *local_178;
  ClientContext *local_170;
  vector<duckdb::BoundOrderByNode,_true> *local_168;
  AggregateFunction local_160;
  
  local_178 = &expr->aggregate;
  local_170 = context;
  local_180 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
              ::operator*(local_178);
  if ((local_180->order_dependent == ORDER_DEPENDENT) &&
     ((expr->arg_orders).
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (expr->arg_orders).
      super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    pBVar10 = (expr->orders).
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (expr->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar10 != pBVar1) {
      local_168 = &expr->arg_orders;
      do {
        type = pBVar10->type;
        null_order = pBVar10->null_order;
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar10->expression);
        (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_198,pEVar7);
        local_1a8._M_head_impl =
             (Expression *)
             local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        BoundOrderByNode::BoundOrderByNode
                  ((BoundOrderByNode *)&local_160,type,null_order,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_1a8);
        ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
        emplace_back<duckdb::BoundOrderByNode>
                  (&local_168->
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ,(BoundOrderByNode *)&local_160);
        sVar5 = local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                _M_string_length;
        if ((BaseStatistics *)
            local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
            _M_string_length != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics
                    ((BaseStatistics *)
                     local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                     _M_string_length);
          operator_delete((void *)sVar5);
        }
        local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length
             = 0;
        if ((long *)local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                    _M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_160.super_BaseScalarFunction.super_SimpleFunction.
                                super_Function.name._M_dataplus._M_p + 8))();
        }
        local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p
             = (pointer)0x0;
        if (local_1a8._M_head_impl != (Expression *)0x0) {
          (*((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_1a8._M_head_impl = (Expression *)0x0;
        if ((Expression *)
            local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (Expression *)0x0) {
          (*((BaseExpression *)
            &(local_198.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start)->id_)->_vptr_BaseExpression[1])();
        }
        pBVar10 = pBVar10 + 1;
      } while (pBVar10 != pBVar1);
    }
  }
  context_p = local_170;
  if (((expr->arg_orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (expr->arg_orders).
       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (expr->children).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this = &expr->arg_orders;
    if (((local_170->config).enable_optimizer == true) &&
       (bVar6 = BoundOrderModifier::Simplify(this,&expr->partitions), bVar6)) {
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
      _M_erase_at_end(&this->
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                      ,(this->
                       super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ).
                       super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      return;
    }
    this_00 = (SortedAggregateBindData *)operator_new(0x1d8);
    pAVar8 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
             ::operator*(local_178);
    bind_info = &expr->bind_info;
    SortedAggregateBindData::SortedAggregateBindData
              (this_00,context_p,&expr->children,pAVar8,bind_info,this);
    local_1a0._M_head_impl = (FunctionData *)this_00;
    pSVar9 = unique_ptr<duckdb::SortedAggregateBindData,_std::default_delete<duckdb::SortedAggregateBindData>,_true>
             ::operator->((unique_ptr<duckdb::SortedAggregateBindData,_std::default_delete<duckdb::SortedAggregateBindData>,_true>
                           *)&local_1a0);
    if (pSVar9->sorted_on_args == false) {
      pBVar1 = (expr->arg_orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar10 = (expr->arg_orders).
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     .
                     super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ._M_impl.super__Vector_impl_data._M_start; pBVar10 != pBVar1;
          pBVar10 = pBVar10 + 1) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&expr->children,&pBVar10->expression);
      }
    }
    local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
              (&local_198,
               (long)(expr->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(expr->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    pAVar8 = local_180;
    this_01 = (expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (expr->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_01 != puVar2) {
      do {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_01);
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_198,
                   &pEVar7->return_type);
        this_01 = this_01 + 1;
      } while (this_01 != puVar2);
    }
    AggregateFunction::AggregateFunction
              (&local_160,
               &(pAVar8->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
               (vector<duckdb::LogicalType,_true> *)&local_198,
               &(pAVar8->super_BaseScalarFunction).return_type,
               AggregateFunction::StateSize<duckdb::SortedAggregateState>,
               AggregateFunction::
               StateInitialize<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction,(duckdb::AggregateDestructorType)1>
               ,SortedAggregateFunction::ScatterUpdate,
               AggregateFunction::
               StateCombine<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction>,
               SortedAggregateFunction::Finalize,(pAVar8->super_BaseScalarFunction).null_handling,
               SortedAggregateFunction::SimpleUpdate,(bind_aggregate_function_t)0x0,
               AggregateFunction::
               StateDestroy<duckdb::SortedAggregateState,duckdb::SortedAggregateFunction>,
               (aggregate_statistics_t)0x0,SortedAggregateFunction::Window,
               (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
    AggregateFunction::operator=(pAVar8,&local_160);
    _Var4._M_head_impl = local_1a0._M_head_impl;
    local_1a0._M_head_impl = (FunctionData *)0x0;
    _Var3._M_head_impl =
         (bind_info->
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (bind_info->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
    _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var3._M_head_impl != (FunctionData *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_FunctionData[1])();
    }
    ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
    _M_erase_at_end(&this->
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ,(this->
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ).
                     super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_02476990;
    if (local_160.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_198);
    if (local_1a0._M_head_impl != (FunctionData *)0x0) {
      (*(local_1a0._M_head_impl)->_vptr_FunctionData[1])();
    }
  }
  return;
}

Assistant:

void FunctionBinder::BindSortedAggregate(ClientContext &context, BoundWindowExpression &expr) {
	//	Make implicit orderings explicit
	auto &aggregate = *expr.aggregate;
	if (aggregate.order_dependent == AggregateOrderDependent::ORDER_DEPENDENT && expr.arg_orders.empty()) {
		for (auto &order : expr.orders) {
			const auto type = order.type;
			const auto null_order = order.null_order;
			auto expression = order.expression->Copy();
			expr.arg_orders.emplace_back(BoundOrderByNode(type, null_order, std::move(expression)));
		}
	}

	if (expr.arg_orders.empty() || expr.children.empty()) {
		// not a sorted aggregate: return
		return;
	}
	// Remove unnecessary ORDER BY clauses and return if nothing remains
	if (context.config.enable_optimizer) {
		if (BoundOrderModifier::Simplify(expr.arg_orders, expr.partitions)) {
			expr.arg_orders.clear();
			return;
		}
	}
	auto &children = expr.children;
	auto &arg_orders = expr.arg_orders;
	auto sorted_bind = make_uniq<SortedAggregateBindData>(context, expr);

	if (!sorted_bind->sorted_on_args) {
		// The arguments are the children plus the sort columns.
		for (auto &order : arg_orders) {
			children.emplace_back(std::move(order.expression));
		}
	}

	vector<LogicalType> arguments;
	arguments.reserve(children.size());
	for (const auto &child : children) {
		arguments.emplace_back(child->return_type);
	}

	// Replace the aggregate with the wrapper
	AggregateFunction ordered_aggregate(
	    aggregate.name, arguments, aggregate.return_type, AggregateFunction::StateSize<SortedAggregateState>,
	    AggregateFunction::StateInitialize<SortedAggregateState, SortedAggregateFunction,
	                                       AggregateDestructorType::LEGACY>,
	    SortedAggregateFunction::ScatterUpdate,
	    AggregateFunction::StateCombine<SortedAggregateState, SortedAggregateFunction>,
	    SortedAggregateFunction::Finalize, aggregate.null_handling, SortedAggregateFunction::SimpleUpdate, nullptr,
	    AggregateFunction::StateDestroy<SortedAggregateState, SortedAggregateFunction>, nullptr,
	    SortedAggregateFunction::Window);

	aggregate = std::move(ordered_aggregate);
	expr.bind_info = std::move(sorted_bind);
	expr.arg_orders.clear();
}